

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

double __thiscall soplex::SPxScaler<double>::minAbsRowscale(SPxScaler<double> *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int __exponent;
  double dVar4;
  
  lVar2 = (long)this->m_activeRowscaleExp->thesize;
  if (lVar2 < 1) {
    __exponent = 0x7fffffff;
  }
  else {
    __exponent = 0x7fffffff;
    lVar3 = 0;
    do {
      iVar1 = this->m_activeRowscaleExp->data[lVar3];
      if (iVar1 < __exponent) {
        __exponent = iVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  dVar4 = ldexp(1.0,__exponent);
  return dVar4;
}

Assistant:

R SPxScaler<R>::minAbsRowscale() const
{
   const DataArray < int >& rowscaleExp = *m_activeRowscaleExp;

   int mini = std::numeric_limits<int>::max();

   for(int i = 0; i < rowscaleExp.size(); ++i)
      if(rowscaleExp[i] < mini)
         mini = rowscaleExp[i];

   return spxLdexp(1.0, mini);
}